

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O1

void __thiscall
crnlib::vector<crnlib::dynamic_string>::~vector(vector<crnlib::dynamic_string> *this)

{
  uint uVar1;
  dynamic_string *pdVar2;
  long lVar3;
  long lVar4;
  
  pdVar2 = this->m_p;
  if (pdVar2 != (dynamic_string *)0x0) {
    uVar1 = this->m_size;
    if ((ulong)uVar1 != 0) {
      lVar4 = 0;
      do {
        lVar3 = *(long *)((long)&pdVar2->m_pStr + lVar4);
        if ((lVar3 != 0) && ((*(uint *)(lVar3 + -8) ^ *(uint *)(lVar3 + -4)) == 0xffffffff)) {
          crnlib_free((void *)(lVar3 + -0x10));
        }
        lVar4 = lVar4 + 0x10;
      } while ((ulong)uVar1 << 4 != lVar4);
    }
    crnlib_free(this->m_p);
  }
  return;
}

Assistant:

inline ~vector()
        {
            if (m_p)
            {
                scalar_type<T>::destruct_array(m_p, m_size);
                crnlib_free(m_p);
            }
        }